

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_tgz.c
# Opt level: O0

void test_read_format_tgz(void)

{
  int iVar1;
  wchar_t wVar2;
  archive *a_00;
  int r;
  archive *a;
  archive_entry *ae;
  
  a_00 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tgz.c"
                   ,L'(',(uint)(a_00 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all(a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tgz.c"
                      ,L')',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                      (void *)0x0);
  iVar1 = archive_read_support_filter_gzip(a_00);
  if (iVar1 == -0x14) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tgz.c"
                   ,L',');
    test_skipping("gzip reading not fully supported on this platform");
    iVar1 = archive_read_free(a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tgz.c"
                        ,L'-',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  else {
    iVar1 = archive_read_support_format_all(a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tgz.c"
                        ,L'0',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                        (void *)0x0);
    iVar1 = archive_read_open_memory(a_00,archive,0x5d);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tgz.c"
                        ,L'2',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_read_open_memory(a, archive, sizeof(archive))",(void *)0x0);
    iVar1 = archive_read_next_header(a_00,(archive_entry **)&a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tgz.c"
                        ,L'3',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                        (void *)0x0);
    iVar1 = archive_file_count(a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tgz.c"
                        ,L'4',1,"1",(long)iVar1,"archive_file_count(a)",(void *)0x0);
    iVar1 = archive_filter_code(a_00,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tgz.c"
                        ,L'6',(long)iVar1,"archive_filter_code(a, 0)",1,"ARCHIVE_FILTER_GZIP",
                        (void *)0x0);
    iVar1 = archive_format(a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tgz.c"
                        ,L'7',(long)iVar1,"archive_format(a)",0x30001,"ARCHIVE_FORMAT_TAR_USTAR",
                        (void *)0x0);
    wVar2 = archive_entry_is_encrypted((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tgz.c"
                        ,L'8',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
    iVar1 = archive_read_has_encrypted_entries(a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tgz.c"
                        ,L'9',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                        "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a_00);
    iVar1 = archive_read_close(a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tgz.c"
                        ,L':',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    iVar1 = archive_read_free(a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tgz.c"
                        ,L';',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  return;
}

Assistant:

DEFINE_TEST(test_read_format_tgz)
{
	struct archive_entry *ae;
	struct archive *a;
	int r;

	assert((a = archive_read_new()) != NULL);
	assertEqualInt(ARCHIVE_OK, archive_read_support_filter_all(a));
	r = archive_read_support_filter_gzip(a);
	if (r == ARCHIVE_WARN) {
		skipping("gzip reading not fully supported on this platform");
		assertEqualInt(ARCHIVE_OK, archive_read_free(a));
		return;
	}
	assertEqualInt(ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualInt(ARCHIVE_OK,
	    archive_read_open_memory(a, archive, sizeof(archive)));
	assertEqualInt(ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_file_count(a));
	assertEqualInt(archive_filter_code(a, 0),
	    ARCHIVE_FILTER_GZIP);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_TAR_USTAR);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK,archive_read_free(a));
}